

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_snapshots.cpp
# Opt level: O3

bool SaveSNA_ZX(path *fname,word start)

{
  byte *pbVar1;
  pointer pcVar2;
  CDevice *pCVar3;
  ulong uVar4;
  bool bVar5;
  byte bVar6;
  int iVar8;
  int iVar9;
  int iVar10;
  FILE *__s;
  CDeviceSlot *pCVar11;
  CDevicePage *pCVar12;
  size_t sVar13;
  uint uVar14;
  undefined8 *puVar15;
  aint i;
  char *pcVar16;
  uchar uVar17;
  long lVar18;
  int address;
  FILE *ff;
  byte snbuf [31];
  int pages128 [3];
  long *local_88 [2];
  long local_78 [2];
  undefined8 local_68;
  undefined5 uStack_60;
  word wStack_5b;
  undefined1 uStack_59;
  undefined7 uStack_58;
  undefined8 local_51;
  ulong local_48;
  undefined8 local_3c;
  int local_34;
  byte bVar7;
  
  if (DeviceID == (char *)0x0) {
    pcVar16 = "[SAVESNA] Only for real device emulation mode.";
  }
  else {
    bVar5 = IsZXSpectrumDevice(DeviceID);
    if (bVar5) {
      __s = (FILE *)SJ_fopen(fname,"wb");
      if (__s == (FILE *)0x0) {
        pcVar2 = (fname->_M_pathname)._M_dataplus._M_p;
        local_88[0] = local_78;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_88,pcVar2,pcVar2 + (fname->_M_pathname)._M_string_length);
        Error("opening file for write",(char *)local_88[0],PASS3);
        if (local_88[0] != local_78) {
          operator_delete(local_88[0],local_78[0] + 1);
        }
      }
      else {
        local_68 = 0x440000369b27583f;
        uStack_60 = 0x5cdc2d2b00;
        uStack_59 = 0x3a;
        uStack_58 = 0x540000ff3c5c;
        local_51 = 0x7010000;
        wStack_5b = start;
        iVar8 = strcmp(DeviceID,"ZXSPECTRUM48");
        local_48 = (ulong)(uint)Device->ZxRamTop;
        iVar9 = Device->ZxRamTop - 3;
        uVar14 = (uint)(iVar8 != 0) * 2 - 2;
        bVar5 = true;
        do {
          pCVar3 = Device;
          if ((int)uVar14 < 0) {
            uVar17 = '\0';
          }
          else {
            uVar17 = "\x03\x13"[uVar14];
          }
          iVar10 = CDevice::GetSlotOfA16(Device,iVar9 + uVar14);
          pCVar11 = CDevice::GetSlot(pCVar3,iVar10);
          pCVar12 = CDevice::GetPage(Device,(int)pCVar11->InitialPage);
          pCVar3 = Device;
          bVar5 = (bool)(bVar5 & uVar17 == pCVar12->RAM
                                           [(long)(int)(iVar9 + uVar14) & (long)pCVar12->Size - 1U])
          ;
          uVar14 = uVar14 + 1;
        } while (uVar14 != 4);
        bVar6 = (byte)(start >> 8);
        bVar7 = (byte)start;
        if (bVar5) {
          if (iVar8 == 0) {
            iVar9 = (int)local_48;
            address = iVar9 + -4;
            iVar10 = CDevice::GetSlotOfA16(Device,address);
            pCVar11 = CDevice::GetSlot(pCVar3,iVar10);
            pCVar12 = CDevice::GetPage(Device,(int)pCVar11->InitialPage);
            pCVar12->RAM[(long)address & (long)pCVar12->Size - 1U] = bVar6;
            pCVar3 = Device;
            iVar9 = iVar9 + -5;
            iVar10 = CDevice::GetSlotOfA16(Device,iVar9);
            pCVar11 = CDevice::GetSlot(pCVar3,iVar10);
            pCVar12 = CDevice::GetPage(Device,(int)pCVar11->InitialPage);
            pCVar12->RAM[(long)iVar9 & (long)pCVar12->Size - 1U] = bVar7;
          }
          local_51 = CONCAT62(local_51._2_6_,(short)iVar9);
        }
        else if (iVar8 == 0) {
          WarningById(W_SNA_48,(char *)0x0,W_PASS3);
          local_51 = CONCAT62(local_51._2_6_,0x4000);
          pCVar12 = CDevice::GetPage(Device,1);
          *pCVar12->RAM = bVar7;
          pCVar12 = CDevice::GetPage(Device,1);
          pCVar12->RAM[1] = bVar6;
        }
        else {
          local_51 = CONCAT62(local_51._2_6_,0x6000);
        }
        sVar13 = fwrite(&local_68,1,0x1b,__s);
        if (sVar13 == 0x1b) {
          local_3c = 0x200000005;
          pCVar11 = CDevice::GetSlot(Device,3);
          local_34 = pCVar11->Page->Number;
          puVar15 = (undefined8 *)&DAT_001655b0;
          if (iVar8 != 0) {
            puVar15 = &local_3c;
          }
          lVar18 = 0;
          do {
            iVar9 = *(int *)((long)puVar15 + lVar18);
            pCVar12 = CDevice::GetPage(Device,iVar9);
            pbVar1 = pCVar12->RAM;
            pCVar12 = CDevice::GetPage(Device,iVar9);
            sVar13 = fwrite(pbVar1,1,(long)pCVar12->Size,__s);
            pCVar12 = CDevice::GetPage(Device,iVar9);
            uVar4 = local_51;
            if (pCVar12->Size != (int)sVar13) goto LAB_00119170;
            lVar18 = lVar18 + 4;
          } while (lVar18 != 0xc);
          if (iVar8 == 0) {
LAB_001190e9:
            iVar9 = Device->PagesCount;
            pCVar12 = CDevice::GetPage(Device,0);
            pcVar16 = W_SNA_128;
            if (0x20000 < iVar9 * pCVar12->Size) {
              pcVar2 = (fname->_M_pathname)._M_dataplus._M_p;
              local_88[0] = local_78;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_88,pcVar2,pcVar2 + (fname->_M_pathname)._M_string_length);
              WarningById(pcVar16,(char *)local_88[0],W_PASS3);
              if (local_88[0] != local_78) {
                operator_delete(local_88[0],local_78[0] + 1);
              }
            }
            fclose(__s);
            return true;
          }
          local_51._6_2_ = SUB82(uVar4,6);
          local_51._0_6_ = CONCAT15(bVar6,CONCAT14(bVar7,(undefined4)local_51));
          pCVar11 = CDevice::GetSlot(Device,3);
          local_51 = (ulong)CONCAT16((char)pCVar11->Page->Number + '\x10',(undefined6)local_51);
          sVar13 = fwrite((void *)((long)&local_51 + 4),1,4,__s);
          if (sVar13 == 4) {
            iVar9 = 0;
            do {
              pCVar11 = CDevice::GetSlot(Device,3);
              if (((iVar9 != pCVar11->Page->Number) && (iVar9 != 2)) && (iVar9 != 5)) {
                pCVar12 = CDevice::GetPage(Device,iVar9);
                pbVar1 = pCVar12->RAM;
                pCVar12 = CDevice::GetPage(Device,iVar9);
                sVar13 = fwrite(pbVar1,1,(long)pCVar12->Size,__s);
                pCVar12 = CDevice::GetPage(Device,iVar9);
                if (pCVar12->Size != (int)sVar13) goto LAB_00119170;
              }
              iVar9 = iVar9 + 1;
            } while (iVar9 != 8);
            goto LAB_001190e9;
          }
        }
LAB_00119170:
        writeError((path *)(fname->_M_pathname)._M_dataplus._M_p,
                   (FILE **)(fname->_M_pathname)._M_string_length);
      }
      return false;
    }
    pcVar16 = "[SAVESNA] Device must be ZXSPECTRUM48 or ZXSPECTRUM128.";
  }
  Error(pcVar16,(char *)0x0,PASS3);
  return false;
}

Assistant:

bool SaveSNA_ZX(const std::filesystem::path & fname, word start) {
	// for Lua
	if (!DeviceID) {
		Error("[SAVESNA] Only for real device emulation mode.");
		return false;
	} else if (!IsZXSpectrumDevice(DeviceID)) {
		Error("[SAVESNA] Device must be ZXSPECTRUM48 or ZXSPECTRUM128.");
		return false;
	}

	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "wb")) {
		Error("opening file for write", fname.string().c_str());
		return false;
	}

	constexpr int SNA_HEADER_48_SIZE = 27;
	constexpr int SNA_HEADER_128_SIZE = 4;
	byte snbuf[SNA_HEADER_48_SIZE + SNA_HEADER_128_SIZE] = {
	//	I     L'    H'    E'    D'    C'    B'    F'    A'    L     H     E     D     C **  B **
		0x3F, 0x58, 0x27, 0x9B, 0x36, 0x00, 0x00, 0x44, 0x00, 0x2B, 0x2D, 0xDC, 0x5C, 0x00, 0x00,
	//	IYL   IYH   IXL   IXH   IFF2  R     F     A     SP(L) SP(H) IM #  border
		0x3A, 0x5C, 0x3C, 0xFF, 0x00, 0x00, 0x54, 0x00, 0x00, 0x00, 0x01, 0x07,
	// end of 48k SNA header, following 4 bytes are extra 128k SNA header "interlude" after 48k data
	//	PC(L) PC(H) 7FFD  TR-DOS
		0x00, 0x00, 0x00, 0x00
	};

	// set BC to start address
	snbuf[13] = start & 0xFF;
	snbuf[14] = (start>>8) & 0xFF;

	// check if default ZX-like stack was modified - if not, it will be used for snapshot
	bool is48kSnap = !strcmp(DeviceID, "ZXSPECTRUM48");
	bool defaultStack = true;
	aint stackAdr = Device->ZxRamTop + 1 - sizeof(ZX_STACK_DATA);
	for (aint ii = is48kSnap ? -2 : 0; ii < aint(sizeof(ZX_STACK_DATA)); ++ii) {
		// will check for 48k snap if there is `00 00` ahead of fake stack data
		const byte cmpValue = (0 <= ii) ? ZX_STACK_DATA[ii] : 0;
		CDeviceSlot* slot = Device->GetSlot(Device->GetSlotOfA16(stackAdr + ii));
		CDevicePage* page = Device->GetPage(slot->InitialPage);
		defaultStack &= (cmpValue == page->RAM[(stackAdr + ii) & (page->Size-1)]);
	}
	if (defaultStack) {
		if (is48kSnap) {
			--stackAdr;
			// inject PC under default stack
			CDeviceSlot* slot = Device->GetSlot(Device->GetSlotOfA16(stackAdr));
			CDevicePage* page = Device->GetPage(slot->InitialPage);
			page->RAM[stackAdr & (page->Size-1)] = (start>>8) & 0xFF;
			--stackAdr;
			slot = Device->GetSlot(Device->GetSlotOfA16(stackAdr));
			page = Device->GetPage(slot->InitialPage);
			page->RAM[stackAdr & (page->Size-1)] = start & 0xFF;
		}
		// SP (may point to injected start address for 48k snap)
		snbuf[23] = (stackAdr) & 0xFF;
		snbuf[24] = (stackAdr>>8) & 0xFF;
	} else {
		if (is48kSnap) {
			WarningById(W_SNA_48);
			snbuf[23] = 0x00; //sp
			snbuf[24] = 0x40; //sp
			Device->GetPage(1)->RAM[0] = start & 0xFF;	//pc
			Device->GetPage(1)->RAM[1] = start >> 8;	//pc
		} else {
			snbuf[23] = 0x00; //sp
			snbuf[24] = 0x60; //sp
		}
	}

	if (fwrite(snbuf, 1, SNA_HEADER_48_SIZE, ff) != SNA_HEADER_48_SIZE) {
		return writeError(fname, ff);
	}

	const int pages48[3] = { 1, 2, 3 };
	const int pages128[3] = { 5, 2, Device->GetSlot(3)->Page->Number };

	for (const int page : is48kSnap ? pages48 : pages128) {
		if ((aint) fwrite(Device->GetPage(page)->RAM, 1, Device->GetPage(page)->Size, ff) != Device->GetPage(page)->Size) {
			return writeError(fname, ff);
		}
	}

	if (!is48kSnap) {
		// 128k snapshot extra header fields
		snbuf[27] = start & 0xFF; //pc
		snbuf[28] = (start>>8) & 0xFF; //pc
		snbuf[29] = 0x10 + Device->GetSlot(3)->Page->Number; //7ffd
		snbuf[30] = 0; //tr-dos
		if (fwrite(snbuf + SNA_HEADER_48_SIZE, 1, SNA_HEADER_128_SIZE, ff) != SNA_HEADER_128_SIZE) {
			return writeError(fname, ff);
		}
		// 128k banks
		for (aint i = 0; i < 8; i++) {
			if (i != Device->GetSlot(3)->Page->Number && i != 2 && i != 5) {
				if ((aint) fwrite(Device->GetPage(i)->RAM, 1, Device->GetPage(i)->Size, ff) != Device->GetPage(i)->Size) {
					return writeError(fname, ff);
				}
			}
		}
	}

	if (128*1024 < Device->PagesCount * Device->GetPage(0)->Size) {
		WarningById(W_SNA_128, fname.string().c_str());
	}

	fclose(ff);
	return true;
}